

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFactored
          (FBXConverter *this,PropertyTable *props,string *colorName,string *factorName,bool *result
          ,bool useTemplate)

{
  undefined7 in_register_00000089;
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  aiVector3t<float> aVar2;
  aiColor3D aVar3;
  bool in_stack_00000008;
  bool ok;
  bool local_4d;
  float local_4c;
  undefined1 local_48 [24];
  
  *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 1;
  aVar2 = PropertyGet<aiVector3t<float>>
                    ((PropertyTable *)colorName,factorName,&local_4d,in_stack_00000008);
  local_4c = aVar2.z;
  local_48._0_4_ = aVar2.x;
  local_48._4_4_ = aVar2.y;
  if (local_4d == false) {
    *(undefined1 *)CONCAT71(in_register_00000089,useTemplate) = 0;
    local_48._0_4_ = 0.0;
    local_48._4_4_ = 0.0;
    local_4c = 0.0;
  }
  else if (*(long *)(result + 8) != 0) {
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = aVar2._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    fVar1 = PropertyGet<float>((PropertyTable *)colorName,(string *)result,&local_4d,
                               in_stack_00000008);
    if (local_4d != false) {
      local_4c = local_4c * fVar1;
      local_48._0_4_ = (float)local_48._0_4_ * fVar1;
      local_48._4_4_ = (float)local_48._4_4_ * fVar1;
    }
  }
  *(ulong *)this = CONCAT44(local_48._4_4_,local_48._0_4_);
  *(float *)&(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start = local_4c;
  aVar3.g = (ai_real)local_48._4_4_;
  aVar3.r = (ai_real)local_48._0_4_;
  aVar3.b = local_4c;
  return aVar3;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFactored(const PropertyTable& props, const std::string& colorName,
            const std::string& factorName, bool& result, bool useTemplate)
        {
            result = true;

            bool ok;
            aiVector3D BaseColor = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }

            // if no factor name, return the colour as is
            if (factorName.empty()) {
                return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
            }

            // otherwise it should be multiplied by the factor, if found.
            float factor = PropertyGet<float>(props, factorName, ok, useTemplate);
            if (ok) {
                BaseColor *= factor;
            }
            return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
        }